

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

bool __thiscall tinyusdz::primvar::PrimVar::is_scalar(PrimVar *this)

{
  bool bVar1;
  bool local_11;
  PrimVar *this_local;
  
  bVar1 = has_value(this);
  local_11 = false;
  if (bVar1) {
    local_11 = tinyusdz::value::TimeSamples::empty(&this->_ts);
  }
  return local_11;
}

Assistant:

bool is_scalar() const {
    return has_value() && _ts.empty();
  }